

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void Eigen::internal::
     conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
     ::run(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *_this,Index size)

{
  DenseStorage<double,__1,__1,_1,_0> *this;
  Index new_cols;
  Index new_rows;
  Index size_local;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *_this_local;
  
  this = (DenseStorage<double,__1,__1,_1,_0> *)
         EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::derived
                   ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)_this);
  DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize(this,size,size,1);
  return;
}

Assistant:

static void run(DenseBase<Derived>& _this, Index size)
  {
    const Index new_rows = Derived::RowsAtCompileTime==1 ? 1 : size;
    const Index new_cols = Derived::RowsAtCompileTime==1 ? size : 1;
    if(IsRelocatable)
      _this.derived().m_storage.conservativeResize(size,new_rows,new_cols);
    else
      Base::run(_this.derived(), new_rows, new_cols);
  }